

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,int num_digits,string_view prefix,
          format_specs specs,bin_writer<1> f)

{
  ulong uVar1;
  ulong uVar2;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<wchar_t>_>::bin_writer<1>_>
  local_58;
  
  local_58.prefix.size_ = prefix.size_;
  local_58.prefix.data_ = prefix.data_;
  local_58.f.abs_value = f.abs_value;
  uVar2 = (uint)num_digits + local_58.prefix.size_;
  local_58.size_ = uVar2;
  local_58.fill = specs.fill.data_[0];
  if ((specs._9_1_ & 0xf) == 4) {
    uVar1 = (ulong)(uint)specs.width;
    local_58.padding = 0;
    if (uVar2 <= uVar1) {
      local_58.size_ = uVar1;
      local_58.padding = uVar1 - uVar2;
    }
  }
  else if (num_digits < specs.precision) {
    local_58.size_ = (uint)specs.precision + local_58.prefix.size_;
    local_58.padding = (ulong)(uint)(specs.precision - num_digits);
    local_58.fill = L'0';
  }
  else {
    local_58.padding = 0;
  }
  if (((undefined1  [32])specs & (undefined1  [32])0xf00) == (undefined1  [32])0x0) {
    specs._9_1_ = specs._9_1_ | 2;
  }
  local_58.f.num_digits = f.num_digits;
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>>>
            (this,&specs,&local_58);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }